

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O1

string * __thiscall
font2svg::glyph::svgfooter_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x270,"\n </g>\n</svg>\n",0xe);
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgfooter()  {
		tmp.str("");
		tmp << "\n </g>\n</svg>\n";
		return tmp.str();
	}